

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perf.c
# Opt level: O0

int parse_int(char *arg,char *what)

{
  char *local_28;
  char *eptr;
  long val;
  char *what_local;
  char *arg_local;
  
  val = (long)what;
  what_local = arg;
  eptr = (char *)strtol(arg,&local_28,10);
  if (((((long)eptr < 0) || (1000000000 < (long)eptr)) || (*local_28 != '\0')) ||
     (local_28 == what_local)) {
    die("Invalid %s",val);
  }
  return (int)eptr;
}

Assistant:

static int
parse_int(const char *arg, const char *what)
{
	long  val;
	char *eptr;

	val = strtol(arg, &eptr, 10);
	// Must be a positive number less than around a billion.
	if ((val < 0) || (val > 1000000000) || (*eptr != 0) || (eptr == arg)) {
		die("Invalid %s", what);
	}
	return ((int) val);
}